

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O0

Tool * __thiscall
llbuild::buildsystem::BuildDescription::addTool
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
          *value)

{
  pointer pTVar1;
  tool_set *this_00;
  pointer this_01;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> *this_02;
  StringRef Key;
  Tool *result;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
  *value_local;
  BuildDescription *this_local;
  
  pTVar1 = std::
           unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
           ::get(value);
  this_00 = getTools(this);
  this_01 = std::
            unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
            ::operator->(value);
  Key = Tool::getName(this_01);
  this_02 = llvm::
            StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
            ::operator[](this_00,Key);
  std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>::
  operator=(this_02,value);
  return pTVar1;
}

Assistant:

Tool& BuildDescription::addTool(std::unique_ptr<Tool> value) {
  auto& result = *value.get();
  getTools()[value->getName()] = std::move(value);
  return result;
}